

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::internal::TracingMuxerImpl::ConsumerImpl::OnConnect(ConsumerImpl *this)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  ScopedFile local_7c;
  type callback;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  this->connected_ = true;
  (*((this->service_)._M_t.
     super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
     ._M_t.
     super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
     .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl)->
    _vptr_ConsumerEndpoint[0xc])();
  if ((this->trace_config_).
      super___shared_ptr<perfetto::protos::gen::TraceConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_7c.t_ = -1;
    SetupTracingSession(this->muxer_,this->session_id_,&this->trace_config_,&local_7c);
    base::
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_7c);
  }
  if (this->start_pending_ == true) {
    StartTracingSession(this->muxer_,this->session_id_);
  }
  if (this->get_trace_stats_pending_ == true) {
    callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    callback.super__Function_base._M_functor._8_8_ = 0;
    callback.super__Function_base._M_manager = (_Manager_type)0x0;
    p_Var1 = (this->get_trace_stats_callback_)._M_invoker;
    p_Var2 = (this->get_trace_stats_callback_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      callback.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)&(this->get_trace_stats_callback_).super__Function_base._M_functor;
      callback.super__Function_base._M_functor._8_8_ =
           *(undefined8 *)
            ((long)&(this->get_trace_stats_callback_).super__Function_base._M_functor + 8);
      (this->get_trace_stats_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->get_trace_stats_callback_)._M_invoker = (_Invoker_type)0x0;
      callback.super__Function_base._M_manager = p_Var2;
    }
    callback._M_invoker = p_Var1;
    std::function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::operator=
              (&this->get_trace_stats_callback_,(nullptr_t)0x0);
    local_48 = (_Manager_type)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    if (p_Var2 != (_Manager_type)0x0) {
      local_58._M_unused._M_object = callback.super__Function_base._M_functor._M_unused._M_object;
      local_58._8_8_ = callback.super__Function_base._M_functor._8_8_;
      callback.super__Function_base._M_manager = (_Manager_type)0x0;
      callback._M_invoker = (_Invoker_type)0x0;
      local_48 = p_Var2;
    }
    local_40 = p_Var1;
    GetTraceStats(this->muxer_,this->session_id_,(GetTraceStatsCallback *)&local_58);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
    ::std::_Function_base::~_Function_base((_Function_base *)&callback);
  }
  p_Var2 = (this->query_service_state_callback_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    p_Var3 = (this->query_service_state_callback_)._M_invoker;
    callback.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)&(this->query_service_state_callback_).super__Function_base._M_functor;
    callback.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)
          ((long)&(this->query_service_state_callback_).super__Function_base._M_functor + 8);
    (this->query_service_state_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->query_service_state_callback_)._M_invoker = (_Invoker_type)0x0;
    std::function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)>::operator=
              (&this->query_service_state_callback_,(nullptr_t)0x0);
    local_38._M_unused._M_object = callback.super__Function_base._M_functor._M_unused._M_object;
    local_38._8_8_ = callback.super__Function_base._M_functor._8_8_;
    callback.super__Function_base._M_manager = (_Manager_type)0x0;
    callback._M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var2;
    local_20 = p_Var3;
    QueryServiceState(this->muxer_,this->session_id_,(QueryServiceStateCallback *)&local_38);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
    ::std::_Function_base::~_Function_base((_Function_base *)&callback);
  }
  if (this->stop_pending_ == true) {
    StopTracingSession(this->muxer_,this->session_id_);
  }
  return;
}

Assistant:

void TracingMuxerImpl::ConsumerImpl::OnConnect() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DCHECK(!connected_);
  connected_ = true;

  // Observe data source instance events so we get notified when tracing starts.
  service_->ObserveEvents(ObservableEvents::TYPE_DATA_SOURCES_INSTANCES |
                          ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED);

  // If the API client configured and started tracing before we connected,
  // tell the backend about it now.
  if (trace_config_)
    muxer_->SetupTracingSession(session_id_, trace_config_);
  if (start_pending_)
    muxer_->StartTracingSession(session_id_);
  if (get_trace_stats_pending_) {
    auto callback = std::move(get_trace_stats_callback_);
    get_trace_stats_callback_ = nullptr;
    muxer_->GetTraceStats(session_id_, std::move(callback));
  }
  if (query_service_state_callback_) {
    auto callback = std::move(query_service_state_callback_);
    query_service_state_callback_ = nullptr;
    muxer_->QueryServiceState(session_id_, std::move(callback));
  }
  if (stop_pending_)
    muxer_->StopTracingSession(session_id_);
}